

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

bool testing::internal::
     TypeParameterizedTestSuite<(anonymous_namespace)::UnsignedToString,_testing::internal::Templates<gtest_suite_UnsignedToString_::Zero,_gtest_suite_UnsignedToString_::One,_gtest_suite_UnsignedToString_::Ten,_gtest_suite_UnsignedToString_::Max>,_testing::internal::Types<unsigned_char,_unsigned_int,_unsigned_long,_unsigned_long_long>_>
     ::Register(char *prefix,CodeLocation *code_location,TypedTestSuitePState *state,char *case_name
               ,char *test_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  byte *pbVar1;
  pointer pcVar2;
  string *psVar3;
  long *plVar4;
  _Alloc_hider _Var5;
  _Alloc_hider _Var6;
  _Alloc_hider _Var7;
  int iVar8;
  char *pcVar9;
  const_iterator cVar10;
  CodeLocation *pCVar11;
  long *plVar12;
  SetUpTearDownSuiteFuncType p_Var13;
  SetUpTearDownSuiteFuncType p_Var14;
  TestFactoryBase *pTVar15;
  char *pcVar16;
  CodeLocation *pCVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  undefined8 extraout_RAX_00;
  long *plVar19;
  size_type *psVar20;
  type_info *ptVar21;
  type_info *ptVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  type_info *ptVar24;
  type_info *ptVar25;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *type_names_00;
  char *pcVar27;
  char *pcVar28;
  ulong uVar29;
  long *local_300;
  long local_2f8;
  long local_2f0;
  long lStack_2e8;
  CodeLocation local_2e0;
  type_info *local_2b8;
  long local_2b0;
  long local_2a8;
  long lStack_2a0;
  long *local_298;
  long local_290;
  long local_288;
  long lStack_280;
  string local_278;
  CodeLocation *local_258;
  string local_250;
  CodeLocation local_230;
  TypedTestSuitePState *local_208;
  string local_200;
  type_info *local_1e0;
  long local_1d8;
  type_info local_1d0;
  undefined7 uStack_1cf;
  long lStack_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  size_type local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a0;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  CodeLocation local_160;
  allocator local_132;
  allocator local_131;
  allocator local_130;
  allocator local_12f;
  allocator local_12e;
  allocator local_12d;
  allocator local_12c;
  allocator local_12b;
  allocator local_12a;
  allocator local_129;
  long *local_128;
  CodeLocation local_120;
  char *local_f8;
  size_type local_f0;
  char local_e8;
  undefined7 uStack_e7;
  undefined8 uStack_e0;
  char *local_d8;
  size_type local_d0;
  char local_c8;
  undefined7 uStack_c7;
  undefined8 uStack_c0;
  string local_b8;
  internal *local_98;
  long local_90;
  long local_88 [2];
  uint local_78;
  string test_name;
  string test_name_1;
  
  local_208 = state;
  local_128 = (long *)prefix;
  RegisterTypeParameterizedTestSuiteInstantiation("UnsignedToString");
  pcVar9 = strchr((char *)code_location,0x2c);
  local_258 = code_location;
  if (pcVar9 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_f8,(char *)code_location,&local_132);
  }
  else {
    local_f8 = &local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,code_location,pcVar9);
  }
  test_name._M_dataplus._M_p = local_f8;
  if (local_f0 != 0) {
    pcVar9 = local_f8 + local_f0;
    do {
      pcVar16 = local_f8;
      iVar8 = isspace((uint)(byte)pcVar9[-1]);
      test_name._M_dataplus._M_p = pcVar16;
      if (iVar8 == 0) break;
      pcVar27 = pcVar9 + -1;
      uVar29 = (long)pcVar27 - (long)pcVar16;
      std::__cxx11::string::_M_erase((ulong)&local_f8,uVar29);
      pcVar9 = local_f8 + uVar29;
      test_name._M_dataplus._M_p = local_f8;
    } while (pcVar27 != pcVar16);
  }
  local_f8 = &local_e8;
  if (test_name._M_dataplus._M_p == local_f8) {
    test_name.field_2._8_8_ = uStack_e0;
    test_name._M_dataplus._M_p = (pointer)&test_name.field_2;
  }
  test_name.field_2._M_allocated_capacity._1_7_ = uStack_e7;
  test_name.field_2._M_local_buf[0] = local_e8;
  test_name._M_string_length = local_f0;
  local_f0 = 0;
  local_e8 = '\0';
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
           ::find(&gtest_typed_test_suite_p_state_UnsignedToString_.registered_tests_._M_t,
                  &test_name);
  iVar8 = 0x246858;
  if ((_Rb_tree_header *)cVar10._M_node ==
      &gtest_typed_test_suite_p_state_UnsignedToString_.registered_tests_._M_t._M_impl.
       super__Rb_tree_header) {
    FormatFileLocation_abi_cxx11_
              (&local_2e0.file,(internal *)*local_128,(char *)(ulong)*(uint *)(local_128 + 4),
               0x246858);
    TypeParameterizedTestSuite<(anonymous_namespace)::UnsignedToString,testing::internal::Templates<gtest_suite_UnsignedToString_::Zero,gtest_suite_UnsignedToString_::One,gtest_suite_UnsignedToString_::Ten,gtest_suite_UnsignedToString_::Max>,testing::internal::Types<unsigned_char,unsigned_int,unsigned_long,unsigned_long_long>>
    ::Register();
  }
  else {
    pCVar11 = TypedTestSuitePState::GetCodeLocation
                        (&gtest_typed_test_suite_p_state_UnsignedToString_,&test_name);
    local_298 = &local_288;
    local_288 = CONCAT44(local_288._4_4_,0x533255);
    local_290 = 3;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_298);
    local_300 = &local_2f0;
    plVar19 = plVar12 + 2;
    if ((long *)*plVar12 == plVar19) {
      local_2f0 = *plVar19;
      lStack_2e8 = plVar12[3];
    }
    else {
      local_2f0 = *plVar19;
      local_300 = (long *)*plVar12;
    }
    local_2f8 = plVar12[1];
    *plVar12 = (long)plVar19;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_300);
    local_160.file._M_dataplus._M_p = (pointer)&local_160.file.field_2;
    psVar20 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar20) {
      local_160.file.field_2._M_allocated_capacity = *psVar20;
      local_160.file.field_2._8_8_ = plVar12[3];
    }
    else {
      local_160.file.field_2._M_allocated_capacity = *psVar20;
      local_160.file._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_160.file._M_string_length = plVar12[1];
    *plVar12 = (long)psVar20;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_160);
    local_230.file._M_dataplus._M_p = (pointer)&local_230.file.field_2;
    psVar20 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar20) {
      local_230.file.field_2._M_allocated_capacity = *psVar20;
      local_230.file.field_2._8_8_ = plVar12[3];
    }
    else {
      local_230.file.field_2._M_allocated_capacity = *psVar20;
      local_230.file._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_230.file._M_string_length = plVar12[1];
    *plVar12 = (long)psVar20;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_230,**(ulong **)local_208);
    pCVar17 = local_258;
    local_2e0.file._M_dataplus._M_p = (pointer)&local_2e0.file.field_2;
    psVar20 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar20) {
      local_2e0.file.field_2._M_allocated_capacity = *psVar20;
      local_2e0.file.field_2._8_8_ = plVar12[3];
    }
    else {
      local_2e0.file.field_2._M_allocated_capacity = *psVar20;
      local_2e0.file._M_dataplus._M_p = (pointer)*plVar12;
    }
    _Var5._M_p = local_2e0.file._M_dataplus._M_p;
    local_2e0.file._M_string_length = plVar12[1];
    *plVar12 = (long)psVar20;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    pcVar9 = strchr((char *)local_258,0x2c);
    if (pcVar9 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_1e0,(char *)pCVar17,&local_131);
    }
    else {
      local_1e0 = &local_1d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pCVar17,pcVar9);
    }
    local_2b8 = local_1e0;
    if (local_1d8 != 0) {
      ptVar21 = local_1e0 + local_1d8;
      do {
        ptVar24 = local_1e0;
        iVar8 = isspace((uint)(byte)ptVar21[-1]);
        local_2b8 = ptVar24;
        if (iVar8 == 0) break;
        ptVar22 = ptVar21 + -1;
        uVar29 = (long)ptVar22 - (long)ptVar24;
        std::__cxx11::string::_M_erase((ulong)&local_1e0,uVar29);
        ptVar21 = local_1e0 + uVar29;
        local_2b8 = local_1e0;
      } while (ptVar22 != ptVar24);
    }
    local_1e0 = &local_1d0;
    if (local_2b8 == local_1e0) {
      lStack_2a0 = lStack_1c8;
      local_2b8 = (type_info *)&local_2a8;
    }
    ptVar21 = local_2b8;
    local_2a8 = CONCAT71(uStack_1cf,local_1d0);
    local_2b0 = local_1d8;
    local_1d8 = 0;
    local_1d0 = (type_info)0x0;
    GetTypeName_abi_cxx11_(&local_278,(internal *)&unsigned_char::typeinfo,local_1e0);
    _Var6._M_p = local_278._M_dataplus._M_p;
    local_120.file._M_dataplus._M_p = (pointer)&local_120.file.field_2;
    pcVar2 = (pCVar11->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,pcVar2,pcVar2 + (pCVar11->file)._M_string_length);
    local_120.line = pCVar11->line;
    p_Var13 = SuiteApiResolver<gtest_suite_UnsignedToString_::Zero<unsigned_char>_>::
              GetSetUpCaseOrSuite((pCVar11->file)._M_dataplus._M_p,local_120.line);
    p_Var14 = SuiteApiResolver<gtest_suite_UnsignedToString_::Zero<unsigned_char>_>::
              GetTearDownCaseOrSuite((pCVar11->file)._M_dataplus._M_p,pCVar11->line);
    pTVar15 = (TestFactoryBase *)operator_new(8);
    pTVar15->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0023e950;
    MakeAndRegisterTestInfo
              (_Var5._M_p,(char *)ptVar21,_Var6._M_p,(char *)0x0,&local_120,
               &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_char>>::dummy_,p_Var13
               ,p_Var14,pTVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.file._M_dataplus._M_p != &local_120.file.field_2) {
      operator_delete(local_120.file._M_dataplus._M_p,
                      local_120.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (local_2b8 != (type_info *)&local_2a8) {
      operator_delete(local_2b8,local_2a8 + 1);
    }
    if (local_1e0 != &local_1d0) {
      operator_delete(local_1e0,CONCAT71(uStack_1cf,local_1d0) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0.file._M_dataplus._M_p != &local_2e0.file.field_2) {
      operator_delete(local_2e0.file._M_dataplus._M_p,
                      local_2e0.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230.file._M_dataplus._M_p != &local_230.file.field_2) {
      operator_delete(local_230.file._M_dataplus._M_p,
                      local_230.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.file._M_dataplus._M_p != &local_160.file.field_2) {
      operator_delete(local_160.file._M_dataplus._M_p,
                      local_160.file.field_2._M_allocated_capacity + 1);
    }
    if (local_300 != &local_2f0) {
      operator_delete(local_300,local_2f0 + 1);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    local_2b8 = (type_info *)&local_2a8;
    local_2a8 = CONCAT44(local_2a8._4_4_,0x533255);
    local_2b0 = 3;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    local_298 = &local_288;
    plVar19 = plVar12 + 2;
    if ((long *)*plVar12 == plVar19) {
      local_288 = *plVar19;
      lStack_280 = plVar12[3];
    }
    else {
      local_288 = *plVar19;
      local_298 = (long *)*plVar12;
    }
    local_290 = plVar12[1];
    *plVar12 = (long)plVar19;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_298);
    local_300 = &local_2f0;
    plVar19 = plVar12 + 2;
    if ((long *)*plVar12 == plVar19) {
      local_2f0 = *plVar19;
      lStack_2e8 = plVar12[3];
    }
    else {
      local_2f0 = *plVar19;
      local_300 = (long *)*plVar12;
    }
    local_2f8 = plVar12[1];
    *plVar12 = (long)plVar19;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_300);
    local_230.file._M_dataplus._M_p = (pointer)&local_230.file.field_2;
    psVar20 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar20) {
      local_230.file.field_2._M_allocated_capacity = *psVar20;
      local_230.file.field_2._8_8_ = plVar12[3];
    }
    else {
      local_230.file.field_2._M_allocated_capacity = *psVar20;
      local_230.file._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_230.file._M_string_length = plVar12[1];
    *plVar12 = (long)psVar20;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_230,*(ulong *)(*(long *)local_208 + 0x20));
    pCVar17 = local_258;
    local_2e0.file._M_dataplus._M_p = (pointer)&local_2e0.file.field_2;
    psVar20 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar20) {
      local_2e0.file.field_2._M_allocated_capacity = *psVar20;
      local_2e0.file.field_2._8_8_ = plVar12[3];
    }
    else {
      local_2e0.file.field_2._M_allocated_capacity = *psVar20;
      local_2e0.file._M_dataplus._M_p = (pointer)*plVar12;
    }
    _Var5._M_p = local_2e0.file._M_dataplus._M_p;
    local_2e0.file._M_string_length = plVar12[1];
    *plVar12 = (long)psVar20;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    pcVar9 = strchr((char *)local_258,0x2c);
    if (pcVar9 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_1c0,(char *)pCVar17,&local_130);
    }
    else {
      local_1c0 = &local_1b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,pCVar17,pcVar9);
    }
    local_278._M_dataplus._M_p = (pointer)local_1c0;
    if (local_1b8 != 0) {
      ptVar21 = (type_info *)(local_1c0->_M_local_buf + local_1b8);
      do {
        paVar18 = local_1c0;
        iVar8 = isspace((uint)(byte)ptVar21[-1]);
        local_278._M_dataplus._M_p = (pointer)paVar18;
        if (iVar8 == 0) break;
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(ptVar21 + -1);
        uVar29 = (long)paVar23 - (long)paVar18;
        std::__cxx11::string::_M_erase((ulong)&local_1c0,uVar29);
        ptVar21 = (type_info *)(local_1c0->_M_local_buf + uVar29);
        local_278._M_dataplus._M_p = (pointer)local_1c0;
      } while (paVar23 != paVar18);
    }
    local_1c0 = &local_1b0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p == local_1c0) {
      local_278.field_2._8_8_ = local_1b0._8_8_;
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    }
    _Var6._M_p = local_278._M_dataplus._M_p;
    local_278.field_2._M_allocated_capacity._1_7_ = local_1b0._M_allocated_capacity._1_7_;
    local_278.field_2._M_local_buf[0] = local_1b0._M_local_buf[0];
    local_278._M_string_length = local_1b8;
    local_1b8 = 0;
    local_1b0._M_local_buf[0] = '\0';
    GetTypeName_abi_cxx11_
              (&local_250,(internal *)&unsigned_int::typeinfo,(type_info *)local_1c0->_M_local_buf);
    _Var7._M_p = local_250._M_dataplus._M_p;
    local_160.file._M_dataplus._M_p = (pointer)&local_160.file.field_2;
    pcVar2 = (pCVar11->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_160,pcVar2,pcVar2 + (pCVar11->file)._M_string_length);
    local_160.line = pCVar11->line;
    p_Var13 = SuiteApiResolver<gtest_suite_UnsignedToString_::Zero<unsigned_int>_>::
              GetSetUpCaseOrSuite((pCVar11->file)._M_dataplus._M_p,local_160.line);
    p_Var14 = SuiteApiResolver<gtest_suite_UnsignedToString_::Zero<unsigned_int>_>::
              GetTearDownCaseOrSuite((pCVar11->file)._M_dataplus._M_p,pCVar11->line);
    pTVar15 = (TestFactoryBase *)operator_new(8);
    pTVar15->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0023e9e8;
    MakeAndRegisterTestInfo
              (_Var5._M_p,_Var6._M_p,_Var7._M_p,(char *)0x0,&local_160,
               &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_int>>::dummy_,p_Var13,
               p_Var14,pTVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.file._M_dataplus._M_p != &local_160.file.field_2) {
      operator_delete(local_160.file._M_dataplus._M_p,
                      local_160.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (local_1c0 != &local_1b0) {
      operator_delete(local_1c0,
                      CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0.file._M_dataplus._M_p != &local_2e0.file.field_2) {
      operator_delete(local_2e0.file._M_dataplus._M_p,
                      local_2e0.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230.file._M_dataplus._M_p != &local_230.file.field_2) {
      operator_delete(local_230.file._M_dataplus._M_p,
                      local_230.file.field_2._M_allocated_capacity + 1);
    }
    if (local_300 != &local_2f0) {
      operator_delete(local_300,local_2f0 + 1);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_2b8 != (type_info *)&local_2a8) {
      operator_delete(local_2b8,local_2a8 + 1);
    }
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    local_278.field_2._M_allocated_capacity._0_4_ = 0x533255;
    local_278._M_string_length = 3;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_278);
    local_2b8 = (type_info *)&local_2a8;
    ptVar21 = (type_info *)(plVar12 + 2);
    if ((type_info *)*plVar12 == ptVar21) {
      local_2a8 = *(long *)ptVar21;
      lStack_2a0 = plVar12[3];
    }
    else {
      local_2a8 = *(long *)ptVar21;
      local_2b8 = (type_info *)*plVar12;
    }
    local_2b0 = plVar12[1];
    *plVar12 = (long)ptVar21;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    local_298 = &local_288;
    plVar19 = plVar12 + 2;
    if ((long *)*plVar12 == plVar19) {
      local_288 = *plVar19;
      lStack_280 = plVar12[3];
    }
    else {
      local_288 = *plVar19;
      local_298 = (long *)*plVar12;
    }
    local_290 = plVar12[1];
    *plVar12 = (long)plVar19;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_298);
    local_300 = &local_2f0;
    plVar19 = plVar12 + 2;
    if ((long *)*plVar12 == plVar19) {
      local_2f0 = *plVar19;
      lStack_2e8 = plVar12[3];
    }
    else {
      local_2f0 = *plVar19;
      local_300 = (long *)*plVar12;
    }
    local_2f8 = plVar12[1];
    *plVar12 = (long)plVar19;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_300,*(ulong *)(*(long *)local_208 + 0x40));
    pCVar17 = local_258;
    local_2e0.file._M_dataplus._M_p = (pointer)&local_2e0.file.field_2;
    psVar20 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar20) {
      local_2e0.file.field_2._M_allocated_capacity = *psVar20;
      local_2e0.file.field_2._8_8_ = plVar12[3];
    }
    else {
      local_2e0.file.field_2._M_allocated_capacity = *psVar20;
      local_2e0.file._M_dataplus._M_p = (pointer)*plVar12;
    }
    _Var5._M_p = local_2e0.file._M_dataplus._M_p;
    local_2e0.file._M_string_length = plVar12[1];
    *plVar12 = (long)psVar20;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    pcVar9 = strchr((char *)local_258,0x2c);
    if (pcVar9 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_1a0,(char *)pCVar17,&local_12f);
    }
    else {
      local_1a0 = &local_190;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,pCVar17,pcVar9);
    }
    local_250._M_dataplus._M_p = (pointer)local_1a0;
    if (local_198 != 0) {
      ptVar21 = (type_info *)(local_1a0->_M_local_buf + local_198);
      do {
        paVar18 = local_1a0;
        iVar8 = isspace((uint)(byte)ptVar21[-1]);
        local_250._M_dataplus._M_p = (pointer)paVar18;
        if (iVar8 == 0) break;
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(ptVar21 + -1);
        uVar29 = (long)paVar23 - (long)paVar18;
        std::__cxx11::string::_M_erase((ulong)&local_1a0,uVar29);
        ptVar21 = (type_info *)(local_1a0->_M_local_buf + uVar29);
        local_250._M_dataplus._M_p = (pointer)local_1a0;
      } while (paVar23 != paVar18);
    }
    local_1a0 = &local_190;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p == local_1a0) {
      local_250.field_2._8_8_ = local_190._8_8_;
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    }
    _Var6._M_p = local_250._M_dataplus._M_p;
    local_250.field_2._M_allocated_capacity._1_7_ = local_190._M_allocated_capacity._1_7_;
    local_250.field_2._M_local_buf[0] = local_190._M_local_buf[0];
    local_250._M_string_length = local_198;
    local_198 = 0;
    local_190._M_local_buf[0] = '\0';
    GetTypeName_abi_cxx11_
              (&local_200,(internal *)&unsigned_long::typeinfo,(type_info *)local_1a0->_M_local_buf)
    ;
    _Var7._M_p = local_200._M_dataplus._M_p;
    local_230.file._M_dataplus._M_p = (pointer)&local_230.file.field_2;
    pcVar2 = (pCVar11->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,pcVar2,pcVar2 + (pCVar11->file)._M_string_length);
    local_230.line = pCVar11->line;
    p_Var13 = SuiteApiResolver<gtest_suite_UnsignedToString_::Zero<unsigned_long>_>::
              GetSetUpCaseOrSuite((pCVar11->file)._M_dataplus._M_p,local_230.line);
    p_Var14 = SuiteApiResolver<gtest_suite_UnsignedToString_::Zero<unsigned_long>_>::
              GetTearDownCaseOrSuite((pCVar11->file)._M_dataplus._M_p,pCVar11->line);
    pTVar15 = (TestFactoryBase *)operator_new(8);
    pTVar15->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0023ea80;
    MakeAndRegisterTestInfo
              (_Var5._M_p,_Var6._M_p,_Var7._M_p,(char *)0x0,&local_230,
               &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_long>>::dummy_,p_Var13
               ,p_Var14,pTVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230.file._M_dataplus._M_p != &local_230.file.field_2) {
      operator_delete(local_230.file._M_dataplus._M_p,
                      local_230.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0,
                      CONCAT71(local_190._M_allocated_capacity._1_7_,local_190._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0.file._M_dataplus._M_p != &local_2e0.file.field_2) {
      operator_delete(local_2e0.file._M_dataplus._M_p,
                      local_2e0.file.field_2._M_allocated_capacity + 1);
    }
    if (local_300 != &local_2f0) {
      operator_delete(local_300,local_2f0 + 1);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_2b8 != (type_info *)&local_2a8) {
      operator_delete(local_2b8,local_2a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    local_250.field_2._M_allocated_capacity._0_4_ = 0x533255;
    local_250._M_string_length = 3;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_250);
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 == paVar18) {
      local_278.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
      local_278.field_2._8_8_ = plVar12[3];
    }
    else {
      local_278.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
      local_278._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_278._M_string_length = plVar12[1];
    *plVar12 = (long)paVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_278);
    local_2b8 = (type_info *)&local_2a8;
    ptVar21 = (type_info *)(plVar12 + 2);
    if ((type_info *)*plVar12 == ptVar21) {
      local_2a8 = *(long *)ptVar21;
      lStack_2a0 = plVar12[3];
    }
    else {
      local_2a8 = *(long *)ptVar21;
      local_2b8 = (type_info *)*plVar12;
    }
    local_2b0 = plVar12[1];
    *plVar12 = (long)ptVar21;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    local_298 = &local_288;
    plVar19 = plVar12 + 2;
    if ((long *)*plVar12 == plVar19) {
      local_288 = *plVar19;
      lStack_280 = plVar12[3];
    }
    else {
      local_288 = *plVar19;
      local_298 = (long *)*plVar12;
    }
    local_290 = plVar12[1];
    *plVar12 = (long)plVar19;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_298,*(ulong *)(*(long *)local_208 + 0x60));
    pCVar17 = local_258;
    local_300 = &local_2f0;
    plVar19 = plVar12 + 2;
    if ((long *)*plVar12 == plVar19) {
      local_2f0 = *plVar19;
      lStack_2e8 = plVar12[3];
    }
    else {
      local_2f0 = *plVar19;
      local_300 = (long *)*plVar12;
    }
    plVar4 = local_300;
    local_2f8 = plVar12[1];
    *plVar12 = (long)plVar19;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    pcVar9 = strchr((char *)local_258,0x2c);
    if (pcVar9 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_180,(char *)pCVar17,&local_12e);
    }
    else {
      local_180 = &local_170;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,pCVar17,pcVar9);
    }
    local_200._M_dataplus._M_p = (pointer)local_180;
    if (local_178 != 0) {
      ptVar21 = (type_info *)(local_180->_M_local_buf + local_178);
      do {
        paVar18 = local_180;
        iVar8 = isspace((uint)(byte)ptVar21[-1]);
        local_200._M_dataplus._M_p = (pointer)paVar18;
        if (iVar8 == 0) break;
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(ptVar21 + -1);
        uVar29 = (long)paVar23 - (long)paVar18;
        std::__cxx11::string::_M_erase((ulong)&local_180,uVar29);
        ptVar21 = (type_info *)(local_180->_M_local_buf + uVar29);
        local_200._M_dataplus._M_p = (pointer)local_180;
      } while (paVar23 != paVar18);
    }
    local_180 = &local_170;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p == local_180) {
      local_200.field_2._8_8_ = local_170._8_8_;
      local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    }
    _Var5._M_p = local_200._M_dataplus._M_p;
    local_200.field_2._M_allocated_capacity._1_7_ = local_170._M_allocated_capacity._1_7_;
    local_200.field_2._M_local_buf[0] = local_170._M_local_buf[0];
    local_200._M_string_length = local_178;
    local_178 = 0;
    local_170._M_local_buf[0] = '\0';
    GetTypeName_abi_cxx11_
              (&local_b8,(internal *)&unsigned_long_long::typeinfo,
               (type_info *)local_180->_M_local_buf);
    _Var6._M_p = local_b8._M_dataplus._M_p;
    local_2e0.file._M_dataplus._M_p = (pointer)&local_2e0.file.field_2;
    pcVar2 = (pCVar11->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0,pcVar2,pcVar2 + (pCVar11->file)._M_string_length);
    local_2e0.line = pCVar11->line;
    p_Var13 = SuiteApiResolver<gtest_suite_UnsignedToString_::Zero<unsigned_long_long>_>::
              GetSetUpCaseOrSuite((pCVar11->file)._M_dataplus._M_p,local_2e0.line);
    p_Var14 = SuiteApiResolver<gtest_suite_UnsignedToString_::Zero<unsigned_long_long>_>::
              GetTearDownCaseOrSuite((pCVar11->file)._M_dataplus._M_p,pCVar11->line);
    pTVar15 = (TestFactoryBase *)operator_new(8);
    pTVar15->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0023eb18;
    MakeAndRegisterTestInfo
              ((char *)plVar4,_Var5._M_p,_Var6._M_p,(char *)0x0,&local_2e0,
               &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_long_long>>::dummy_,
               p_Var13,p_Var14,pTVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0.file._M_dataplus._M_p != &local_2e0.file.field_2) {
      operator_delete(local_2e0.file._M_dataplus._M_p,
                      local_2e0.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if (local_180 != &local_170) {
      operator_delete(local_180,
                      CONCAT71(local_170._M_allocated_capacity._1_7_,local_170._M_local_buf[0]) + 1)
      ;
    }
    if (local_300 != &local_2f0) {
      operator_delete(local_300,local_2f0 + 1);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_2b8 != (type_info *)&local_2a8) {
      operator_delete(local_2b8,local_2a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    local_98 = (internal *)local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,*local_128,local_128[1] + *local_128);
    local_78 = *(uint *)(local_128 + 4);
    pcVar9 = strchr((char *)local_258,0x2c);
    if (pcVar9 == (char *)0x0) {
      pcVar9 = (char *)0x0;
    }
    else {
      do {
        pbVar1 = (byte *)(pcVar9 + 1);
        pcVar9 = pcVar9 + 1;
        iVar8 = isspace((uint)*pbVar1);
      } while (iVar8 != 0);
    }
    RegisterTypeParameterizedTestSuiteInstantiation("UnsignedToString");
    pcVar16 = strchr(pcVar9,0x2c);
    if (pcVar16 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_d8,pcVar9,&local_12d);
    }
    else {
      local_d8 = &local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,pcVar9,pcVar16);
    }
    test_name_1._M_dataplus._M_p = local_d8;
    if (local_d0 != 0) {
      pcVar16 = local_d8 + local_d0;
      do {
        pcVar27 = local_d8;
        iVar8 = isspace((uint)(byte)pcVar16[-1]);
        test_name_1._M_dataplus._M_p = pcVar27;
        if (iVar8 == 0) break;
        pcVar28 = pcVar16 + -1;
        uVar29 = (long)pcVar28 - (long)pcVar27;
        std::__cxx11::string::_M_erase((ulong)&local_d8,uVar29);
        pcVar16 = local_d8 + uVar29;
        test_name_1._M_dataplus._M_p = local_d8;
      } while (pcVar28 != pcVar27);
    }
    local_d8 = &local_c8;
    if (test_name_1._M_dataplus._M_p == local_d8) {
      test_name_1.field_2._8_8_ = uStack_c0;
      test_name_1._M_dataplus._M_p = (pointer)&test_name_1.field_2;
    }
    test_name_1.field_2._M_allocated_capacity._1_7_ = uStack_c7;
    test_name_1.field_2._M_local_buf[0] = local_c8;
    test_name_1._M_string_length = local_d0;
    local_d0 = 0;
    local_c8 = '\0';
    cVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
             ::find(&gtest_typed_test_suite_p_state_UnsignedToString_.registered_tests_._M_t,
                    &test_name_1);
    iVar8 = 0x246858;
    if ((_Rb_tree_header *)cVar10._M_node !=
        &gtest_typed_test_suite_p_state_UnsignedToString_.registered_tests_._M_t._M_impl.
         super__Rb_tree_header) {
      pCVar11 = TypedTestSuitePState::GetCodeLocation
                          (&gtest_typed_test_suite_p_state_UnsignedToString_,&test_name_1);
      local_298 = &local_288;
      local_288 = CONCAT44(local_288._4_4_,0x533255);
      local_290 = 3;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_298);
      local_300 = &local_2f0;
      plVar19 = plVar12 + 2;
      if ((long *)*plVar12 == plVar19) {
        local_2f0 = *plVar19;
        lStack_2e8 = plVar12[3];
      }
      else {
        local_2f0 = *plVar19;
        local_300 = (long *)*plVar12;
      }
      local_2f8 = plVar12[1];
      *plVar12 = (long)plVar19;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_300);
      local_160.file._M_dataplus._M_p = (pointer)&local_160.file.field_2;
      psVar20 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar20) {
        local_160.file.field_2._M_allocated_capacity = *psVar20;
        local_160.file.field_2._8_8_ = plVar12[3];
      }
      else {
        local_160.file.field_2._M_allocated_capacity = *psVar20;
        local_160.file._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_160.file._M_string_length = plVar12[1];
      *plVar12 = (long)psVar20;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_160);
      local_230.file._M_dataplus._M_p = (pointer)&local_230.file.field_2;
      psVar20 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar20) {
        local_230.file.field_2._M_allocated_capacity = *psVar20;
        local_230.file.field_2._8_8_ = plVar12[3];
      }
      else {
        local_230.file.field_2._M_allocated_capacity = *psVar20;
        local_230.file._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_230.file._M_string_length = plVar12[1];
      *plVar12 = (long)psVar20;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_230,**(ulong **)local_208);
      local_2e0.file._M_dataplus._M_p = (pointer)&local_2e0.file.field_2;
      psVar20 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar20) {
        local_2e0.file.field_2._M_allocated_capacity = *psVar20;
        local_2e0.file.field_2._8_8_ = plVar12[3];
      }
      else {
        local_2e0.file.field_2._M_allocated_capacity = *psVar20;
        local_2e0.file._M_dataplus._M_p = (pointer)*plVar12;
      }
      _Var5._M_p = local_2e0.file._M_dataplus._M_p;
      local_2e0.file._M_string_length = plVar12[1];
      *plVar12 = (long)psVar20;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      pcVar16 = strchr(pcVar9,0x2c);
      if (pcVar16 == (char *)0x0) {
        std::__cxx11::string::string((string *)&local_1e0,pcVar9,&local_12c);
      }
      else {
        local_1e0 = &local_1d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar9,pcVar16);
      }
      local_258 = (CodeLocation *)_Var5._M_p;
      ptVar21 = local_1e0;
      if (local_1d8 != 0) {
        ptVar24 = local_1e0 + local_1d8;
        do {
          ptVar22 = local_1e0;
          iVar8 = isspace((uint)(byte)ptVar24[-1]);
          ptVar21 = ptVar22;
          if (iVar8 == 0) break;
          ptVar25 = ptVar24 + -1;
          uVar29 = (long)ptVar25 - (long)ptVar22;
          std::__cxx11::string::_M_erase((ulong)&local_1e0,uVar29);
          ptVar24 = local_1e0 + uVar29;
          ptVar21 = local_1e0;
        } while (ptVar25 != ptVar22);
      }
      local_1e0 = &local_1d0;
      local_2b8 = ptVar21;
      if (ptVar21 == local_1e0) {
        lStack_2a0 = lStack_1c8;
        local_2b8 = (type_info *)&local_2a8;
      }
      ptVar21 = local_2b8;
      local_2a8 = CONCAT71(uStack_1cf,local_1d0);
      local_2b0 = local_1d8;
      local_1d8 = 0;
      local_1d0 = (type_info)0x0;
      GetTypeName_abi_cxx11_(&local_278,(internal *)&unsigned_char::typeinfo,local_1e0);
      _Var5._M_p = local_278._M_dataplus._M_p;
      local_120.file._M_dataplus._M_p = (pointer)&local_120.file.field_2;
      pcVar2 = (pCVar11->file)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_120,pcVar2,pcVar2 + (pCVar11->file)._M_string_length);
      local_120.line = pCVar11->line;
      p_Var13 = SuiteApiResolver<gtest_suite_UnsignedToString_::One<unsigned_char>_>::
                GetSetUpCaseOrSuite((pCVar11->file)._M_dataplus._M_p,local_120.line);
      p_Var14 = SuiteApiResolver<gtest_suite_UnsignedToString_::One<unsigned_char>_>::
                GetTearDownCaseOrSuite((pCVar11->file)._M_dataplus._M_p,pCVar11->line);
      pTVar15 = (TestFactoryBase *)operator_new(8);
      pTVar15->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0023ebb0;
      MakeAndRegisterTestInfo
                ((char *)local_258,(char *)ptVar21,_Var5._M_p,(char *)0x0,&local_120,
                 &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_char>>::dummy_,
                 p_Var13,p_Var14,pTVar15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120.file._M_dataplus._M_p != &local_120.file.field_2) {
        operator_delete(local_120.file._M_dataplus._M_p,
                        local_120.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if (local_2b8 != (type_info *)&local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      if (local_1e0 != &local_1d0) {
        operator_delete(local_1e0,CONCAT71(uStack_1cf,local_1d0) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0.file._M_dataplus._M_p != &local_2e0.file.field_2) {
        operator_delete(local_2e0.file._M_dataplus._M_p,
                        local_2e0.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230.file._M_dataplus._M_p != &local_230.file.field_2) {
        operator_delete(local_230.file._M_dataplus._M_p,
                        local_230.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160.file._M_dataplus._M_p != &local_160.file.field_2) {
        operator_delete(local_160.file._M_dataplus._M_p,
                        local_160.file.field_2._M_allocated_capacity + 1);
      }
      if (local_300 != &local_2f0) {
        operator_delete(local_300,local_2f0 + 1);
      }
      if (local_298 != &local_288) {
        operator_delete(local_298,local_288 + 1);
      }
      local_2b8 = (type_info *)&local_2a8;
      local_2a8 = CONCAT44(local_2a8._4_4_,0x533255);
      local_2b0 = 3;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      local_298 = &local_288;
      plVar19 = plVar12 + 2;
      if ((long *)*plVar12 == plVar19) {
        local_288 = *plVar19;
        lStack_280 = plVar12[3];
      }
      else {
        local_288 = *plVar19;
        local_298 = (long *)*plVar12;
      }
      local_290 = plVar12[1];
      *plVar12 = (long)plVar19;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_298);
      local_300 = &local_2f0;
      plVar19 = plVar12 + 2;
      if ((long *)*plVar12 == plVar19) {
        local_2f0 = *plVar19;
        lStack_2e8 = plVar12[3];
      }
      else {
        local_2f0 = *plVar19;
        local_300 = (long *)*plVar12;
      }
      local_2f8 = plVar12[1];
      *plVar12 = (long)plVar19;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_300);
      local_230.file._M_dataplus._M_p = (pointer)&local_230.file.field_2;
      psVar20 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar20) {
        local_230.file.field_2._M_allocated_capacity = *psVar20;
        local_230.file.field_2._8_8_ = plVar12[3];
      }
      else {
        local_230.file.field_2._M_allocated_capacity = *psVar20;
        local_230.file._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_230.file._M_string_length = plVar12[1];
      *plVar12 = (long)psVar20;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_230,*(ulong *)(*(long *)local_208 + 0x20));
      local_2e0.file._M_dataplus._M_p = (pointer)&local_2e0.file.field_2;
      psVar20 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar20) {
        local_2e0.file.field_2._M_allocated_capacity = *psVar20;
        local_2e0.file.field_2._8_8_ = plVar12[3];
      }
      else {
        local_2e0.file.field_2._M_allocated_capacity = *psVar20;
        local_2e0.file._M_dataplus._M_p = (pointer)*plVar12;
      }
      _Var5._M_p = local_2e0.file._M_dataplus._M_p;
      local_2e0.file._M_string_length = plVar12[1];
      *plVar12 = (long)psVar20;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      pcVar16 = strchr(pcVar9,0x2c);
      if (pcVar16 == (char *)0x0) {
        std::__cxx11::string::string((string *)&local_1c0,pcVar9,&local_12b);
      }
      else {
        local_1c0 = &local_1b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,pcVar9,pcVar16);
      }
      local_258 = (CodeLocation *)_Var5._M_p;
      paVar18 = local_1c0;
      if (local_1b8 != 0) {
        ptVar21 = (type_info *)(local_1c0->_M_local_buf + local_1b8);
        do {
          paVar23 = local_1c0;
          iVar8 = isspace((uint)(byte)ptVar21[-1]);
          paVar18 = paVar23;
          if (iVar8 == 0) break;
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(ptVar21 + -1);
          uVar29 = (long)paVar26 - (long)paVar23;
          std::__cxx11::string::_M_erase((ulong)&local_1c0,uVar29);
          ptVar21 = (type_info *)(local_1c0->_M_local_buf + uVar29);
          paVar18 = local_1c0;
        } while (paVar26 != paVar23);
      }
      local_1c0 = &local_1b0;
      local_278._M_dataplus._M_p = (pointer)paVar18;
      if (paVar18 == local_1c0) {
        local_278.field_2._8_8_ = local_1b0._8_8_;
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      }
      _Var5._M_p = local_278._M_dataplus._M_p;
      local_278.field_2._M_allocated_capacity._1_7_ = local_1b0._M_allocated_capacity._1_7_;
      local_278.field_2._M_local_buf[0] = local_1b0._M_local_buf[0];
      local_278._M_string_length = local_1b8;
      local_1b8 = 0;
      local_1b0._M_local_buf[0] = '\0';
      GetTypeName_abi_cxx11_
                (&local_250,(internal *)&unsigned_int::typeinfo,(type_info *)local_1c0->_M_local_buf
                );
      _Var6._M_p = local_250._M_dataplus._M_p;
      local_160.file._M_dataplus._M_p = (pointer)&local_160.file.field_2;
      pcVar2 = (pCVar11->file)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,pcVar2,pcVar2 + (pCVar11->file)._M_string_length);
      local_160.line = pCVar11->line;
      p_Var13 = SuiteApiResolver<gtest_suite_UnsignedToString_::One<unsigned_int>_>::
                GetSetUpCaseOrSuite((pCVar11->file)._M_dataplus._M_p,local_160.line);
      p_Var14 = SuiteApiResolver<gtest_suite_UnsignedToString_::One<unsigned_int>_>::
                GetTearDownCaseOrSuite((pCVar11->file)._M_dataplus._M_p,pCVar11->line);
      pTVar15 = (TestFactoryBase *)operator_new(8);
      pTVar15->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0023ec48;
      MakeAndRegisterTestInfo
                ((char *)local_258,_Var5._M_p,_Var6._M_p,(char *)0x0,&local_160,
                 &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_int>>::dummy_,
                 p_Var13,p_Var14,pTVar15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160.file._M_dataplus._M_p != &local_160.file.field_2) {
        operator_delete(local_160.file._M_dataplus._M_p,
                        local_160.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if (local_1c0 != &local_1b0) {
        operator_delete(local_1c0,
                        CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0.file._M_dataplus._M_p != &local_2e0.file.field_2) {
        operator_delete(local_2e0.file._M_dataplus._M_p,
                        local_2e0.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230.file._M_dataplus._M_p != &local_230.file.field_2) {
        operator_delete(local_230.file._M_dataplus._M_p,
                        local_230.file.field_2._M_allocated_capacity + 1);
      }
      if (local_300 != &local_2f0) {
        operator_delete(local_300,local_2f0 + 1);
      }
      if (local_298 != &local_288) {
        operator_delete(local_298,local_288 + 1);
      }
      if (local_2b8 != (type_info *)&local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      local_278.field_2._M_allocated_capacity._0_4_ = 0x533255;
      local_278._M_string_length = 3;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_278);
      local_2b8 = (type_info *)&local_2a8;
      ptVar21 = (type_info *)(plVar12 + 2);
      if ((type_info *)*plVar12 == ptVar21) {
        local_2a8 = *(long *)ptVar21;
        lStack_2a0 = plVar12[3];
      }
      else {
        local_2a8 = *(long *)ptVar21;
        local_2b8 = (type_info *)*plVar12;
      }
      local_2b0 = plVar12[1];
      *plVar12 = (long)ptVar21;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      local_298 = &local_288;
      plVar19 = plVar12 + 2;
      if ((long *)*plVar12 == plVar19) {
        local_288 = *plVar19;
        lStack_280 = plVar12[3];
      }
      else {
        local_288 = *plVar19;
        local_298 = (long *)*plVar12;
      }
      local_290 = plVar12[1];
      *plVar12 = (long)plVar19;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_298);
      local_300 = &local_2f0;
      plVar19 = plVar12 + 2;
      if ((long *)*plVar12 == plVar19) {
        local_2f0 = *plVar19;
        lStack_2e8 = plVar12[3];
      }
      else {
        local_2f0 = *plVar19;
        local_300 = (long *)*plVar12;
      }
      local_2f8 = plVar12[1];
      *plVar12 = (long)plVar19;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_300,*(ulong *)(*(long *)local_208 + 0x40));
      local_2e0.file._M_dataplus._M_p = (pointer)&local_2e0.file.field_2;
      psVar20 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar20) {
        local_2e0.file.field_2._M_allocated_capacity = *psVar20;
        local_2e0.file.field_2._8_8_ = plVar12[3];
      }
      else {
        local_2e0.file.field_2._M_allocated_capacity = *psVar20;
        local_2e0.file._M_dataplus._M_p = (pointer)*plVar12;
      }
      _Var5._M_p = local_2e0.file._M_dataplus._M_p;
      local_2e0.file._M_string_length = plVar12[1];
      *plVar12 = (long)psVar20;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      pcVar16 = strchr(pcVar9,0x2c);
      if (pcVar16 == (char *)0x0) {
        std::__cxx11::string::string((string *)&local_1a0,pcVar9,&local_12a);
      }
      else {
        local_1a0 = &local_190;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,pcVar9,pcVar16);
      }
      local_258 = (CodeLocation *)_Var5._M_p;
      paVar18 = local_1a0;
      if (local_198 != 0) {
        ptVar21 = (type_info *)(local_1a0->_M_local_buf + local_198);
        do {
          paVar23 = local_1a0;
          iVar8 = isspace((uint)(byte)ptVar21[-1]);
          paVar18 = paVar23;
          if (iVar8 == 0) break;
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(ptVar21 + -1);
          uVar29 = (long)paVar26 - (long)paVar23;
          std::__cxx11::string::_M_erase((ulong)&local_1a0,uVar29);
          ptVar21 = (type_info *)(local_1a0->_M_local_buf + uVar29);
          paVar18 = local_1a0;
        } while (paVar26 != paVar23);
      }
      local_1a0 = &local_190;
      local_250._M_dataplus._M_p = (pointer)paVar18;
      if (paVar18 == local_1a0) {
        local_250.field_2._8_8_ = local_190._8_8_;
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      }
      _Var5._M_p = local_250._M_dataplus._M_p;
      local_250.field_2._M_allocated_capacity._1_7_ = local_190._M_allocated_capacity._1_7_;
      local_250.field_2._M_local_buf[0] = local_190._M_local_buf[0];
      local_250._M_string_length = local_198;
      local_198 = 0;
      local_190._M_local_buf[0] = '\0';
      GetTypeName_abi_cxx11_
                (&local_200,(internal *)&unsigned_long::typeinfo,
                 (type_info *)local_1a0->_M_local_buf);
      _Var6._M_p = local_200._M_dataplus._M_p;
      local_230.file._M_dataplus._M_p = (pointer)&local_230.file.field_2;
      pcVar2 = (pCVar11->file)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,pcVar2,pcVar2 + (pCVar11->file)._M_string_length);
      local_230.line = pCVar11->line;
      p_Var13 = SuiteApiResolver<gtest_suite_UnsignedToString_::One<unsigned_long>_>::
                GetSetUpCaseOrSuite((pCVar11->file)._M_dataplus._M_p,local_230.line);
      p_Var14 = SuiteApiResolver<gtest_suite_UnsignedToString_::One<unsigned_long>_>::
                GetTearDownCaseOrSuite((pCVar11->file)._M_dataplus._M_p,pCVar11->line);
      pTVar15 = (TestFactoryBase *)operator_new(8);
      pTVar15->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0023ece0;
      MakeAndRegisterTestInfo
                ((char *)local_258,_Var5._M_p,_Var6._M_p,(char *)0x0,&local_230,
                 &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_long>>::dummy_,
                 p_Var13,p_Var14,pTVar15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230.file._M_dataplus._M_p != &local_230.file.field_2) {
        operator_delete(local_230.file._M_dataplus._M_p,
                        local_230.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0,
                        CONCAT71(local_190._M_allocated_capacity._1_7_,local_190._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0.file._M_dataplus._M_p != &local_2e0.file.field_2) {
        operator_delete(local_2e0.file._M_dataplus._M_p,
                        local_2e0.file.field_2._M_allocated_capacity + 1);
      }
      if (local_300 != &local_2f0) {
        operator_delete(local_300,local_2f0 + 1);
      }
      if (local_298 != &local_288) {
        operator_delete(local_298,local_288 + 1);
      }
      if (local_2b8 != (type_info *)&local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      local_250.field_2._M_allocated_capacity._0_4_ = 0x533255;
      local_250._M_string_length = 3;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_250);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 == paVar18) {
        local_278.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_278.field_2._8_8_ = plVar12[3];
      }
      else {
        local_278.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_278._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_278._M_string_length = plVar12[1];
      *plVar12 = (long)paVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_278);
      local_2b8 = (type_info *)&local_2a8;
      ptVar21 = (type_info *)(plVar12 + 2);
      if ((type_info *)*plVar12 == ptVar21) {
        local_2a8 = *(long *)ptVar21;
        lStack_2a0 = plVar12[3];
      }
      else {
        local_2a8 = *(long *)ptVar21;
        local_2b8 = (type_info *)*plVar12;
      }
      local_2b0 = plVar12[1];
      *plVar12 = (long)ptVar21;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      local_298 = &local_288;
      plVar19 = plVar12 + 2;
      if ((long *)*plVar12 == plVar19) {
        local_288 = *plVar19;
        lStack_280 = plVar12[3];
      }
      else {
        local_288 = *plVar19;
        local_298 = (long *)*plVar12;
      }
      local_290 = plVar12[1];
      *plVar12 = (long)plVar19;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_298,*(ulong *)(*(long *)local_208 + 0x60));
      local_300 = &local_2f0;
      plVar19 = plVar12 + 2;
      if ((long *)*plVar12 == plVar19) {
        local_2f0 = *plVar19;
        lStack_2e8 = plVar12[3];
      }
      else {
        local_2f0 = *plVar19;
        local_300 = (long *)*plVar12;
      }
      plVar4 = local_300;
      local_2f8 = plVar12[1];
      *plVar12 = (long)plVar19;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      pcVar16 = strchr(pcVar9,0x2c);
      if (pcVar16 == (char *)0x0) {
        std::__cxx11::string::string((string *)&local_180,pcVar9,&local_129);
      }
      else {
        local_180 = &local_170;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,pcVar9,pcVar16);
      }
      local_258 = (CodeLocation *)plVar4;
      paVar18 = local_180;
      if (local_178 != 0) {
        ptVar21 = (type_info *)(local_180->_M_local_buf + local_178);
        do {
          paVar23 = local_180;
          iVar8 = isspace((uint)(byte)ptVar21[-1]);
          paVar18 = paVar23;
          if (iVar8 == 0) break;
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(ptVar21 + -1);
          uVar29 = (long)paVar26 - (long)paVar23;
          std::__cxx11::string::_M_erase((ulong)&local_180,uVar29);
          ptVar21 = (type_info *)(local_180->_M_local_buf + uVar29);
          paVar18 = local_180;
        } while (paVar26 != paVar23);
      }
      local_180 = &local_170;
      local_200._M_dataplus._M_p = (pointer)paVar18;
      if (paVar18 == local_180) {
        local_200.field_2._8_8_ = local_170._8_8_;
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
      }
      _Var5._M_p = local_200._M_dataplus._M_p;
      local_200.field_2._M_allocated_capacity._1_7_ = local_170._M_allocated_capacity._1_7_;
      local_200.field_2._M_local_buf[0] = local_170._M_local_buf[0];
      local_200._M_string_length = local_178;
      local_178 = 0;
      local_170._M_local_buf[0] = '\0';
      GetTypeName_abi_cxx11_
                (&local_b8,(internal *)&unsigned_long_long::typeinfo,
                 (type_info *)local_180->_M_local_buf);
      _Var6._M_p = local_b8._M_dataplus._M_p;
      local_2e0.file._M_dataplus._M_p = (pointer)&local_2e0.file.field_2;
      pcVar2 = (pCVar11->file)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2e0,pcVar2,pcVar2 + (pCVar11->file)._M_string_length);
      local_2e0.line = pCVar11->line;
      p_Var13 = SuiteApiResolver<gtest_suite_UnsignedToString_::One<unsigned_long_long>_>::
                GetSetUpCaseOrSuite((pCVar11->file)._M_dataplus._M_p,local_2e0.line);
      p_Var14 = SuiteApiResolver<gtest_suite_UnsignedToString_::One<unsigned_long_long>_>::
                GetTearDownCaseOrSuite((pCVar11->file)._M_dataplus._M_p,pCVar11->line);
      pTVar15 = (TestFactoryBase *)operator_new(8);
      pTVar15->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0023ed78;
      type_names_00 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_long_long>>::dummy_;
      pCVar11 = &local_2e0;
      pcVar16 = (char *)0x0;
      MakeAndRegisterTestInfo
                ((char *)local_258,_Var5._M_p,_Var6._M_p,(char *)0x0,pCVar11,
                 &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_long_long>>::dummy_,
                 p_Var13,p_Var14,pTVar15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0.file._M_dataplus._M_p != &local_2e0.file.field_2) {
        operator_delete(local_2e0.file._M_dataplus._M_p,
                        local_2e0.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      if (local_180 != &local_170) {
        operator_delete(local_180,
                        CONCAT71(local_170._M_allocated_capacity._1_7_,local_170._M_local_buf[0]) +
                        1);
      }
      if (local_300 != &local_2f0) {
        operator_delete(local_300,local_2f0 + 1);
      }
      if (local_298 != &local_288) {
        operator_delete(local_298,local_288 + 1);
      }
      if (local_2b8 != (type_info *)&local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      local_2e0.file._M_dataplus._M_p = (pointer)&local_2e0.file.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_2e0,local_98,local_98 + local_90);
      local_2e0.line = local_78;
      pCVar17 = (CodeLocation *)strchr(pcVar9,0x2c);
      if (pCVar17 == (CodeLocation *)0x0) {
        pCVar17 = (CodeLocation *)0x0;
      }
      else {
        do {
          psVar3 = &pCVar17->file;
          pCVar17 = (CodeLocation *)((long)&(pCVar17->file)._M_dataplus._M_p + 1);
          iVar8 = isspace((uint)*(byte *)((long)&(psVar3->_M_dataplus)._M_p + 1));
        } while (iVar8 != 0);
      }
      TypeParameterizedTestSuite<(anonymous_namespace)::UnsignedToString,_testing::internal::Templates<gtest_suite_UnsignedToString_::Ten,_gtest_suite_UnsignedToString_::Max>,_testing::internal::Types<unsigned_char,_unsigned_int,_unsigned_long,_unsigned_long_long>_>
      ::Register((char *)&local_2e0,pCVar17,local_208,pcVar16,(char *)pCVar11,type_names_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0.file._M_dataplus._M_p != &local_2e0.file.field_2) {
        operator_delete(local_2e0.file._M_dataplus._M_p,
                        local_2e0.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)test_name_1._M_dataplus._M_p != &test_name_1.field_2) {
        operator_delete(test_name_1._M_dataplus._M_p,test_name_1.field_2._M_allocated_capacity + 1);
      }
      if (local_98 != (internal *)local_88) {
        operator_delete(local_98,local_88[0] + 1);
      }
      paVar18 = &test_name.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)test_name._M_dataplus._M_p != paVar18) {
        operator_delete(test_name._M_dataplus._M_p,test_name.field_2._M_allocated_capacity + 1);
        paVar18 = extraout_RAX;
      }
      return SUB81(paVar18,0);
    }
  }
  FormatFileLocation_abi_cxx11_(&local_2e0.file,local_98,(char *)(ulong)local_78,iVar8);
  TypeParameterizedTestSuite<(anonymous_namespace)::UnsignedToString,testing::internal::Templates<gtest_suite_UnsignedToString_::Zero,gtest_suite_UnsignedToString_::One,gtest_suite_UnsignedToString_::Ten,gtest_suite_UnsignedToString_::Max>,testing::internal::Types<unsigned_char,unsigned_int,unsigned_long,unsigned_long_long>>
  ::Register();
  if (local_300 != &local_2f0) {
    operator_delete(local_300,local_2f0 + 1);
  }
  if (local_298 != &local_288) {
    operator_delete(local_298,local_288 + 1);
  }
  if (local_2b8 != (type_info *)&local_2a8) {
    operator_delete(local_2b8,local_2a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test_name_1._M_dataplus._M_p != &test_name_1.field_2) {
    operator_delete(test_name_1._M_dataplus._M_p,test_name_1.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != (internal *)local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test_name._M_dataplus._M_p != &test_name.field_2) {
    operator_delete(test_name._M_dataplus._M_p,test_name.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_00);
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const TypedTestSuitePState* state, const char* case_name,
                       const char* test_names,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    RegisterTypeParameterizedTestSuiteInstantiation(case_name);
    std::string test_name = StripTrailingSpaces(
        GetPrefixUntilComma(test_names));
    if (!state->TestExists(test_name)) {
      fprintf(stderr, "Failed to get code location for test %s.%s at %s.",
              case_name, test_name.c_str(),
              FormatFileLocation(code_location.file.c_str(),
                                 code_location.line).c_str());
      fflush(stderr);
      posix::Abort();
    }
    const CodeLocation& test_location = state->GetCodeLocation(test_name);

    typedef typename Tests::Head Head;

    // First, register the first test in 'Test' for each type in 'Types'.
    TypeParameterizedTest<Fixture, Head, Types>::Register(
        prefix, test_location, case_name, test_names, 0, type_names);

    // Next, recurses (at compile time) with the tail of the test list.
    return TypeParameterizedTestSuite<Fixture, typename Tests::Tail,
                                      Types>::Register(prefix, code_location,
                                                       state, case_name,
                                                       SkipComma(test_names),
                                                       type_names);
  }